

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::down_heap
          (clusterizer<crnlib::vec<6U,_float>_> *this,uint pos)

{
  float fVar1;
  float fVar2;
  uint i;
  uint uVar3;
  uint *puVar4;
  vq_node *pvVar5;
  uint in_ESI;
  long in_RDI;
  float orig_variance;
  uint orig;
  uint child;
  uint local_10;
  uint local_c;
  
  puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x38),in_ESI);
  i = *puVar4;
  pvVar5 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                     ((vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                      (in_RDI + 0x10),i);
  fVar1 = pvVar5->m_variance;
  local_c = in_ESI;
  while (local_10 = local_c * 2, local_10 <= *(uint *)(in_RDI + 0x48)) {
    if (local_10 < *(uint *)(in_RDI + 0x48)) {
      puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x38),local_10);
      pvVar5 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                         ((vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                          (in_RDI + 0x10),*puVar4);
      fVar2 = pvVar5->m_variance;
      puVar4 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)(in_RDI + 0x38),local_10 + 1);
      pvVar5 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                         ((vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                          (in_RDI + 0x10),*puVar4);
      if (fVar2 < pvVar5->m_variance) {
        local_10 = local_10 + 1;
      }
    }
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x38),local_10);
    pvVar5 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                       ((vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                        (in_RDI + 0x10),*puVar4);
    if (pvVar5->m_variance <= fVar1 && fVar1 != pvVar5->m_variance) break;
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x38),local_10);
    uVar3 = *puVar4;
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x38),local_c);
    *puVar4 = uVar3;
    local_c = local_10;
  }
  puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x38),local_c);
  *puVar4 = i;
  return;
}

Assistant:

void down_heap(uint pos) {
    uint child;
    uint orig = m_heap[pos];

    const float orig_variance = m_nodes[orig].m_variance;

    while ((child = (pos << 1)) <= m_heap_size) {
      if (child < m_heap_size) {
        if (m_nodes[m_heap[child]].m_variance < m_nodes[m_heap[child + 1]].m_variance)
          child++;
      }

      if (orig_variance > m_nodes[m_heap[child]].m_variance)
        break;

      m_heap[pos] = m_heap[child];

      pos = child;
    }

    m_heap[pos] = orig;
  }